

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_config.cpp
# Opt level: O1

int main(void)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  char *pcVar2;
  size_t sVar3;
  char *pcVar4;
  ostream *poVar5;
  tm *ptVar6;
  info *piVar7;
  locale loc;
  locale l;
  char buf [1024];
  time_t local_438;
  string local_430 [8];
  string local_428 [32];
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"- Backends: ",0xc);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"icu:",4);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"70.1",4);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," ",1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"std ",4);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"posix ",6);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '(');
  std::ostream::put('(');
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"- With iconv",0xc);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '(');
  std::ostream::put('(');
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"- Environment ",0xe);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '(');
  std::ostream::put('(');
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"  LANG=",7);
  pcVar2 = getenv("LANG");
  if (pcVar2 == (char *)0x0) {
    pcVar2 = "";
  }
  sVar3 = strlen(pcVar2);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar2,sVar3);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '(');
  std::ostream::put('(');
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"  LC_ALL=",9);
  pcVar2 = getenv("LC_ALL");
  if (pcVar2 == (char *)0x0) {
    pcVar2 = "";
  }
  sVar3 = strlen(pcVar2);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar2,sVar3);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '(');
  std::ostream::put('(');
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"  LC_CTYPE=",0xb);
  pcVar2 = getenv("LC_CTYPE");
  if (pcVar2 == (char *)0x0) {
    pcVar2 = "";
  }
  sVar3 = strlen(pcVar2);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar2,sVar3);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '(');
  std::ostream::put('(');
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"  TZ=",5);
  pcVar2 = getenv("TZ");
  if (pcVar2 == (char *)0x0) {
    pcVar2 = "";
  }
  sVar3 = strlen(pcVar2);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar2,sVar3);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '(');
  std::ostream::put('(');
  std::ostream::flush();
  pcVar4 = setlocale(6,"");
  pcVar2 = "undetected";
  if (pcVar4 != (char *)0x0) {
    pcVar2 = pcVar4;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"- C locale: ",0xc);
  sVar3 = strlen(pcVar2);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar2,sVar3);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '(');
  std::ostream::put('(');
  std::ostream::flush();
  std::locale::locale((locale *)&local_438,"");
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"- C++ locale: ",0xe);
  std::locale::name_abi_cxx11_();
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,local_428[0]._M_dataplus._M_p,
                      local_428[0]._M_string_length);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
  std::ostream::put((char)poVar5);
  std::ostream::flush();
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_428[0]._M_dataplus._M_p != &local_428[0].field_2) {
    operator_delete(local_428[0]._M_dataplus._M_p);
  }
  std::locale::~locale((locale *)&local_438);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"- Testing locales availability on the operation system:",0x37);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '(');
  std::ostream::put('(');
  std::ostream::flush();
  check_locale(&PTR_anon_var_dwarf_34a2_00105cb0);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"--- Testing Japanese_Japan.932 is working: ",0x2b);
  paVar1 = &local_428[0].field_2;
  local_428[0]._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_428,"Japanese_Japan.932","");
  test_std_supports_SJIS_codecvt(local_428);
  poVar5 = std::ostream::_M_insert<bool>(true);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
  std::ostream::put((char)poVar5);
  std::ostream::flush();
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_428[0]._M_dataplus._M_p != paVar1) {
    operator_delete(local_428[0]._M_dataplus._M_p);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"- Testing timezone and time ",0x1c);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '(');
  std::ostream::put('(');
  std::ostream::flush();
  setlocale(6,"C");
  local_438 = time((time_t *)0x0);
  ptVar6 = localtime(&local_438);
  strftime((char *)local_428,0x400,"%%c=%c; %%Z=%Z; %%z=%z",ptVar6);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"  Local Time    :",0x11)
  ;
  sVar3 = strlen((char *)local_428);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,(char *)local_428,sVar3);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '(');
  std::ostream::put('(');
  std::ostream::flush();
  ptVar6 = gmtime(&local_438);
  strftime((char *)local_428,0x400,"%%c=%c; %%Z=%Z; %%z=%z",ptVar6);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"  Universal Time:",0x11)
  ;
  sVar3 = strlen((char *)local_428);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,(char *)local_428,sVar3);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '(');
  std::ostream::put('(');
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"- Boost.Locale\'s locale: ",0x19);
  booster::locale::generator::generator((generator *)&local_438);
  local_428[0]._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_428,"");
  booster::locale::generator::generate(local_430);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_428[0]._M_dataplus._M_p != paVar1) {
    operator_delete(local_428[0]._M_dataplus._M_p);
  }
  piVar7 = std::use_facet<booster::locale::info>((locale *)local_430);
  (**(code **)(*(long *)piVar7 + 0x10))(local_428,piVar7,4);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,local_428[0]._M_dataplus._M_p,
                      local_428[0]._M_string_length);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
  std::ostream::put((char)poVar5);
  std::ostream::flush();
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_428[0]._M_dataplus._M_p != paVar1) {
    operator_delete(local_428[0]._M_dataplus._M_p);
  }
  std::locale::~locale((locale *)local_430);
  booster::locale::generator::~generator((generator *)&local_438);
  return 0;
}

Assistant:

int main()
{
    std::cout << "- Backends: ";
    #ifdef BOOSTER_LOCALE_WITH_ICU
    std::cout << "icu:" << U_ICU_VERSION << " ";
    #endif
    #ifndef BOOSTER_LOCALE_NO_STD_BACKEND
    std::cout << "std ";
    #endif
    #ifndef BOOSTER_LOCALE_NO_POSIX_BACKEND
    std::cout << "posix ";
    #endif
    #ifndef BOOSTER_LOCALE_NO_WINAPI_BACKEND
    std::cout << "winapi";
    #endif
    std::cout << std::endl;
    #ifdef BOOSTER_LOCALE_WITH_ICONV
    std::cout << "- With iconv" << std::endl;
    #else
    std::cout << "- Without iconv" << std::endl;
    #endif
    std::cout << "- Environment " << std::endl;
    std::cout << "  LANG="<< env("LANG") << std::endl;
    std::cout << "  LC_ALL="<< env("LC_ALL") << std::endl;
    std::cout << "  LC_CTYPE="<< env("LC_CTYPE") << std::endl;
    std::cout << "  TZ="<< env("TZ") << std::endl;

    char const *clocale=setlocale(LC_ALL,"");
    if(!clocale)
        clocale= "undetected";
    std::cout <<"- C locale: " << clocale << std::endl;

    try {
        std::locale loc("");
        std::cout << "- C++ locale: " << loc.name() << std::endl;
    }
    catch(std::exception const &) {
        std::cout << "- C++ locale: is not supported" << std::endl;
    }

    char const *locales_to_check[] = {
        "en_US.UTF-8", "en_US.ISO8859-1", "English_United States.1252",
        "he_IL.UTF-8", "he_IL.ISO8859-8", "Hebrew_Israel.1255",
        "ru_RU.UTF-8", "Russian_Russia.1251",
        "tr_TR.UTF-8", "Turkish_Turkey.1254",
        "ja_JP.UTF-8", "ja_JP.SJIS", "Japanese_Japan.932",
        0
    };
    std::cout << "- Testing locales availability on the operation system:" << std::endl;
    check_locale(locales_to_check);
    std::cout << "--- Testing Japanese_Japan.932 is working: " << test_std_supports_SJIS_codecvt("Japanese_Japan.932") << std::endl;

    std::cout << "- Testing timezone and time " << std::endl;
    {
        setlocale(LC_ALL,"C");
        time_t now = time(0);
        char buf[1024];
        strftime(buf,sizeof(buf),"%%c=%c; %%Z=%Z; %%z=%z",localtime(&now));
        std::cout << "  Local Time    :" << buf << std::endl;
        strftime(buf,sizeof(buf),"%%c=%c; %%Z=%Z; %%z=%z",gmtime(&now));
        std::cout << "  Universal Time:" << buf << std::endl;
    }
    std::cout << "- Boost.Locale's locale: ";
    try {
        booster::locale::generator gen;
        std::locale l = gen("");
        std::cout << std::use_facet<booster::locale::info>(l).name() << std::endl;
    }
    catch(std::exception const &) {
        std::cout << " undetected" << std::endl;
        return EXIT_FAILURE;
    }
    return EXIT_SUCCESS;

}